

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

void sect_AbsLongGroup(uint8_t *s,size_t length)

{
  bool bVar1;
  size_t local_18;
  size_t length_local;
  uint8_t *s_local;
  
  bVar1 = checkcodesection();
  if ((bVar1) &&
     (bVar1 = reserveSpace((uint32_t)(length << 2)), local_18 = length, length_local = (size_t)s,
     bVar1)) {
    while (local_18 != 0) {
      writelong((uint)*(byte *)length_local);
      local_18 = local_18 - 1;
      length_local = length_local + 1;
    }
  }
  return;
}

Assistant:

void sect_AbsLongGroup(uint8_t const *s, size_t length)
{
	if (!checkcodesection())
		return;
	if (!reserveSpace(length * 4))
		return;

	while (length--)
		writelong(*s++);
}